

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
JsSerializeParserStateCore
          (byte *script,size_t cb,LoadScriptFlag loadScriptFlag,uchar *buffer,uint *bufferSize)

{
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  JsrtContext *pJVar4;
  SourceContextInfo *pSVar5;
  undefined4 *puVar6;
  TempArenaAllocatorObject *tempAllocator;
  FunctionBody *pFVar7;
  size_t sVar8;
  JsErrorCode JVar9;
  ulong uVar10;
  undefined1 auStack_108 [8];
  CompileScriptException se;
  SRCINFO local_a0;
  AutoNestedHandledExceptionType local_78 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  JavascriptFunction *local_58;
  JavascriptFunction *function;
  Utf8SourceInfo *sourceInfo;
  uchar *buffer_local;
  ScriptContext *local_38;
  
  se.hasLineNumberInfo = false;
  se._81_7_ = 0;
  auStack_108._0_4_ = 0;
  auStack_108._4_4_ = 0;
  se.super_ScriptException.ichMin = 0;
  se.super_ScriptException.ichLim = 0;
  se.super_ScriptException.ei.wCode = 0;
  se.super_ScriptException.ei.wReserved = 0;
  se.super_ScriptException.ei._4_4_ = 0;
  se.super_ScriptException.ei.bstrSource = (BSTR)0x0;
  se.super_ScriptException.ei.bstrDescription = (BSTR)0x0;
  se.super_ScriptException.ei.bstrHelpFile = (BSTR)0x0;
  se.super_ScriptException.ei.dwHelpContext = 0;
  se.super_ScriptException.ei._36_4_ = 0;
  se.super_ScriptException.ei.pvReserved = (PVOID)0x0;
  se.super_ScriptException.ei.pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
  se.super_ScriptException.ei.scode = 0;
  se.super_ScriptException.ei._60_4_ = 0;
  se.line._0_1_ = 0;
  sourceInfo = (Utf8SourceInfo *)buffer;
  pJVar4 = JsrtContext::GetCurrent();
  JVar9 = JsErrorNoCurrentContext;
  if (pJVar4 == (JsrtContext *)0x0) goto LAB_0038a517;
  local_38 = (((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_78,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  JVar9 = JsErrorNullArgument;
  if (bufferSize != (uint *)0x0 && script != (byte *)0x0) {
    buffer_local = (uchar *)cb;
    if ((ulong)*bufferSize != 0) {
      if (sourceInfo == (Utf8SourceInfo *)0x0) goto LAB_0038a494;
      memset(sourceInfo,0,(ulong)*bufferSize);
    }
    bVar2 = Js::ScriptContext::IsScriptContextInDebugMode(local_38);
    JVar9 = JsErrorCannotSerializeDebugScript;
    if (!bVar2) {
      pSVar5 = Js::ScriptContext::GetSourceContextInfo
                         (local_38,0xffffffffffffffff,(SimpleDataCacheWrapper *)0x0);
      if (pSVar5 == (SourceContextInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                           ,0x1497,"(sourceContextInfo != nullptr)","sourceContextInfo != nullptr");
        if (!bVar2) goto LAB_0038a7bb;
        *puVar6 = 0;
      }
      pSVar5->nextLocalFunctionId = 0;
      uVar10 = (ulong)buffer_local >>
               ((loadScriptFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_None);
      Memory::Recycler::WBSetBit((char *)&local_a0);
      local_a0.sourceContextInfo.ptr = pSVar5;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_a0);
      local_a0.dlnHost = 0;
      local_a0.ulColumnHost = 0;
      local_a0.lnMinHost = 0;
      local_a0.ichMinHost = 0;
      local_a0.ichLimHost = (Type)uVar10;
      local_a0.ulCharOffset = 0;
      local_a0.moduleID = 0;
      local_a0.grfsi = 0;
      function = (JavascriptFunction *)0x0;
      tempAllocator = Js::ScriptContext::GetTemporaryAllocator(local_38,L"ByteCodeSerializer");
      HVar3 = Js::ScriptContext::SerializeParserState
                        (local_38,script,(size_t)buffer_local,&local_a0,
                         (CompileScriptException *)auStack_108,(Utf8SourceInfo **)&function,
                         L"Global code",loadScriptFlag | LoadScriptFlag_CreateParserState,
                         (byte **)&sourceInfo,bufferSize,&tempAllocator->allocator,&local_58,
                         (Var)0x0);
      Js::ScriptContext::ReleaseTemporaryAllocator(local_38,tempAllocator);
      if (local_58 == (JavascriptFunction *)0x0) {
        HandleScriptCompileError(local_38,(CompileScriptException *)auStack_108,(WCHAR *)0x0);
        JVar9 = JsErrorScriptCompile;
      }
      else {
        pFVar7 = Js::JavascriptFunction::GetFunctionBody(local_58);
        function = (JavascriptFunction *)
                   (pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
        sVar8 = Js::Utf8SourceInfo::GetCbLength
                          ((Utf8SourceInfo *)function,L"JsSerializeParserState");
        JVar9 = JsErrorOutOfMemory;
        if (sVar8 >> 0x20 == 0) {
          JVar9 = HVar3 >> 0x1f & JsErrorScriptCompile;
        }
      }
    }
  }
LAB_0038a494:
  if ((((JVar9 - JsErrorNoCurrentContext < 7) &&
       ((0x43U >> (JVar9 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) ||
      (JVar9 == JsErrorScriptException)) || (JVar9 == JsErrorOutOfMemory)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                       ,0x11f,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar2) {
LAB_0038a7bb:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_78);
LAB_0038a517:
  CompileScriptException::~CompileScriptException((CompileScriptException *)auStack_108);
  return JVar9;
}

Assistant:

CHAKRA_API JsSerializeParserStateCore(
    _In_z_ const byte* script,
    _In_ size_t cb,
    _In_ LoadScriptFlag loadScriptFlag,
    _Out_writes_to_opt_(*bufferSize, *bufferSize) unsigned char *buffer,
    _Inout_ unsigned int *bufferSize)
{
    Js::JavascriptFunction *function;
    CompileScriptException se;

    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(script);
        PARAM_NOT_NULL(bufferSize);

        if (*bufferSize > 0)
        {
            PARAM_NOT_NULL(buffer);
            ZeroMemory(buffer, *bufferSize);
        }

        if (scriptContext->IsScriptContextInDebugMode())
        {
            return JsErrorCannotSerializeDebugScript;
        }

        SourceContextInfo * sourceContextInfo = scriptContext->GetSourceContextInfo(JS_SOURCE_CONTEXT_NONE, nullptr);
        Assert(sourceContextInfo != nullptr);
        sourceContextInfo->nextLocalFunctionId = 0;

        const int chsize = (loadScriptFlag & LoadScriptFlag_Utf8Source) ?
            sizeof(utf8char_t) : sizeof(WCHAR);

        SRCINFO si = {
            /* sourceContextInfo   */ sourceContextInfo,
            /* dlnHost             */ 0,
            /* ulColumnHost        */ 0,
            /* lnMinHost           */ 0,
            /* ichMinHost          */ 0,
            /* ichLimHost          */ static_cast<ULONG>(cb / chsize), // OK to truncate since this is used to limit sourceText in debugDocument/compilation errors.
            /* ulCharOffset        */ 0,
            /* mod                 */ kmodGlobal,
            /* grfsi               */ 0
        };

        Js::Utf8SourceInfo* sourceInfo = nullptr;
        loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_CreateParserState);

        BEGIN_TEMP_ALLOCATOR(tempAllocator, scriptContext, _u("ByteCodeSerializer"));
        // We cast buffer size to DWORD* because on Windows, DWORD = unsigned long = unsigned int
        // On 64-bit clang on linux, this is not true, unsigned long is larger than unsigned int
        // However, the PAL defines DWORD for us on linux as unsigned int so the cast is safe here.
        HRESULT hr = scriptContext->SerializeParserState(script, cb, &si, &se, &sourceInfo,
            Js::Constants::GlobalCode, loadScriptFlag, &buffer, (DWORD*)bufferSize, tempAllocator, &function, nullptr);
        END_TEMP_ALLOCATOR(tempAllocator, scriptContext);

        if (function == nullptr)
        {
            HandleScriptCompileError(scriptContext, &se);
            return JsErrorScriptCompile;
        }

        Js::FunctionBody *functionBody = function->GetFunctionBody();
        sourceInfo = functionBody->GetUtf8SourceInfo();
        size_t cSourceCodeLength = sourceInfo->GetCbLength(_u("JsSerializeParserState"));

        // truncation of code length can lead to accessing random memory. Reject the call.
        if (cSourceCodeLength > DWORD_MAX)
        {
            return JsErrorOutOfMemory;
        }

        if (SUCCEEDED(hr))
        {
            return JsNoError;
        }
        else
        {
            return JsErrorScriptCompile;
        }
    });
}